

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

Database_Result * __thiscall
Database::RawQuery(Database_Result *__return_storage_ptr__,Database *this,char *query,
                  bool tx_control)

{
  long *plVar1;
  Database_Result *pDVar2;
  int iVar3;
  long lVar4;
  size_type __new_size;
  mapped_type *this_00;
  undefined8 uVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  string *host;
  char *pcVar8;
  Database *pDVar9;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plVar10;
  uint uVar11;
  allocator<char> local_109;
  ulong local_108;
  Database_Result *local_100;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_f8;
  undefined8 *local_f0;
  string *local_e8;
  undefined4 local_dc;
  string *local_d8;
  char *local_d0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  resrow;
  variant rescell;
  string local_50;
  
  if (this->connected == false) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar6[1] = "Not connected to database.";
    *puVar6 = &PTR__exception_001bc518;
    __cxa_throw(puVar6,&Database_QueryFailed::typeinfo,std::exception::~exception);
  }
  local_f0 = (undefined8 *)strlen(query);
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  local_100 = __return_storage_ptr__;
  if (this->engine == SQLite) {
    iVar3 = sqlite3_exec(((this->impl)._M_t.
                          super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                          .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                         query,sqlite_callback,this,0);
    if (iVar3 != 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar8 = (char *)sqlite3_errmsg(((this->impl)._M_t.
                                       super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                       .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl
                                      )->field_0);
      goto LAB_00124002;
    }
    Database_Result::operator=(local_100,&this->callbackdata);
    std::
    vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
    ::clear(&(this->callbackdata).
             super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           );
  }
  else {
    local_dc = (undefined4)CONCAT71(in_register_00000009,tx_control);
    if (this->engine != MySQL) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      pcVar8 = "Unknown database engine";
LAB_00124002:
      puVar6[1] = pcVar8;
      *puVar6 = &PTR__exception_001bc518;
      __cxa_throw(puVar6,&Database_QueryFailed::typeinfo,std::exception::~exception);
    }
    local_d8 = &this->host;
    local_e8 = &this->db;
    local_f8 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->transaction_log;
    local_108 = 0;
    host = local_d8;
    uVar7 = local_108;
    local_d0 = query;
LAB_00123a1e:
    local_108 = uVar7;
    iVar3 = mysql_real_query(((this->impl)._M_t.
                              super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                              .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                             field_0,query,local_f0);
    if (iVar3 != 0) {
      iVar3 = mysql_errno(((this->impl)._M_t.
                           super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                           .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
      if (((iVar3 != 0x4b5) && (iVar3 != 0x7dd)) && (iVar3 != 0x7d6)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar5 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        puVar6[1] = uVar5;
        *puVar6 = &PTR__exception_001bc518;
        __cxa_throw(puVar6,&Database_QueryFailed::typeinfo,std::exception::~exception);
      }
      uVar11 = 0;
LAB_00123a60:
      do {
        uVar11 = uVar11 + 1;
        if (10 < (int)uVar11) {
          Console::Err("Could not re-connect to database. Halting server.");
          goto LAB_00123f09;
        }
        Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)",
                     (ulong)uVar11);
        pDVar9 = this;
        Close(this);
        util::sleep((uint)pDVar9);
        Connect(this,this->engine,host,(unsigned_short)this->port,&this->user,&this->pass,local_e8);
      } while (this->connected == false);
      uVar7 = local_108;
      if (this->in_transaction != true) goto LAB_00123a1e;
      iVar3 = mysql_real_query(((this->impl)._M_t.
                                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                               field_0,"START TRANSACTION",0x11);
      uVar7 = local_108;
      plVar10 = local_f8;
      if (iVar3 == 0) {
        while( true ) {
          plVar10 = *(list<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)plVar10;
          host = local_d8;
          query = local_d0;
          if (plVar10 == local_f8) goto LAB_00123a1e;
          iVar3 = mysql_real_query(((this->impl)._M_t.
                                    super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                    .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                   field_0,*(size_t *)(plVar10 + 0x10),
                                   *(undefined8 *)(plVar10 + 0x18));
          local_108 = uVar7;
          if (iVar3 == 0) {
            local_108 = mysql_use_result(((this->impl)._M_t.
                                          super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                          .super__Head_base<0UL,_Database::impl__*,_false>.
                                         _M_head_impl)->field_0);
          }
          iVar3 = mysql_errno(((this->impl)._M_t.
                               super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                               .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                              field_0);
          if (iVar3 != 0) break;
          uVar7 = 0;
          if (local_108 != 0) {
            mysql_free_result(local_108);
            uVar7 = 0;
          }
        }
        host = local_d8;
        query = local_d0;
        if (((iVar3 == 0x4b5) || (iVar3 == 0x7d6)) || (iVar3 == 0x7dd)) goto LAB_00123a60;
        uVar5 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        Console::Err("Error during recovery: %s",uVar5);
        Console::Err("Halting server.");
      }
      else {
        iVar3 = mysql_errno(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        if (((iVar3 == 0x4b5) || (iVar3 == 0x7dd)) || (iVar3 == 0x7d6)) goto LAB_00123a60;
        uVar5 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        Console::Err("Error during recovery: %s",uVar5);
        Console::Err("Halting server.");
      }
LAB_00123f09:
      std::terminate();
    }
    if ((this->in_transaction == true && (char)local_dc == '\0') &&
       (iVar3 = strncmp(query,"SELECT",6), iVar3 != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rescell,query,(allocator<char> *)&resrow);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &rescell);
      std::__cxx11::string::~string((string *)&rescell);
    }
    uVar11 = mysql_field_count(((this->impl)._M_t.
                                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                               field_0);
    lVar4 = mysql_store_result(((this->impl)._M_t.
                                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                               field_0);
    if (lVar4 == 0) {
      if (uVar11 != 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar5 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        puVar6[1] = uVar5;
        *puVar6 = &PTR__exception_001bc518;
        __cxa_throw(puVar6,&Database_QueryFailed::typeinfo,std::exception::~exception);
      }
      iVar3 = mysql_affected_rows(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
      local_100->affected_rows = iVar3;
    }
    else {
      puVar6 = (undefined8 *)mysql_fetch_fields(lVar4);
      local_e8 = (string *)(ulong)uVar11;
      if ((int)uVar11 < 1) {
        local_e8 = (string *)0;
      }
      uVar7 = 0;
      while ((long)local_e8 * 0x80 + 0x80U != uVar7 + 0x80) {
        plVar1 = (long *)((long)puVar6 + uVar7);
        uVar7 = uVar7 + 0x80;
        if (*plVar1 == 0) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          puVar6[1] = "libMySQL critical failure!";
          *puVar6 = &PTR__exception_001bc518;
          __cxa_throw(puVar6,&Database_QueryFailed::typeinfo,std::exception::~exception);
        }
      }
      __new_size = mysql_num_rows(lVar4);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::resize(&local_100->
                super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               ,__new_size);
      local_f8 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lVar4;
      local_f0 = puVar6;
      lVar4 = mysql_fetch_row(lVar4);
      local_108 = 0;
      while (pDVar2 = local_100, lVar4 != 0) {
        resrow._M_h._M_buckets = &resrow._M_h._M_single_bucket;
        resrow._M_h._M_bucket_count = 1;
        resrow._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        resrow._M_h._M_element_count = 0;
        resrow._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        resrow._M_h._M_rehash_policy._M_next_resize = 0;
        resrow._M_h._M_single_bucket = (__node_base_ptr)0x0;
        puVar6 = local_f0;
        for (uVar7 = 0; local_e8 != (string *)uVar7; uVar7 = uVar7 + 1) {
          util::variant::variant(&rescell);
          iVar3 = *(int *)(puVar6 + 0xe);
          if (((iVar3 < 10 && iVar3 != 7) || (iVar3 == 0xf6)) || (iVar3 == 0xd)) {
            pcVar8 = *(char **)(lVar4 + uVar7 * 8);
            if (pcVar8 == (char *)0x0) {
              util::variant::operator=(&rescell,0);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,pcVar8,&local_109);
              iVar3 = util::to_int(&local_50);
              util::variant::operator=(&rescell,iVar3);
              std::__cxx11::string::~string((string *)&local_50);
            }
          }
          else {
            pcVar8 = *(char **)(lVar4 + uVar7 * 8);
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "";
            }
            util::variant::operator=(&rescell,pcVar8);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)*puVar6,&local_109);
          this_00 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&resrow._M_h,&local_50);
          util::variant::operator=(this_00,&rescell);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&rescell.val_string);
          puVar6 = puVar6 + 0x10;
        }
        iVar3 = (int)local_108;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::operator=(&(local_100->
                     super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                     ).
                     super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar3]._M_h,&resrow._M_h);
        local_108 = (ulong)(iVar3 + 1);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&resrow._M_h);
        lVar4 = mysql_fetch_row(local_f8);
      }
      mysql_free_result(local_f8);
      local_100 = pDVar2;
    }
  }
  return local_100;
}

Assistant:

Database_Result Database::RawQuery(const char* query, bool tx_control)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::size_t query_length = std::strlen(query);

	Database_Result result;

#ifdef DATABASE_DEBUG
	Console::Dbg("%s", query);
#endif // DATABASE_DEBUG

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
		{
			MYSQL_RES* mresult = nullptr;
			MYSQL_FIELD* fields = nullptr;
			int num_fields = 0;

			exec_query:
			if (mysql_real_query(this->impl->mysql_handle, query, query_length) != 0)
			{
				int myerr = mysql_errno(this->impl->mysql_handle);
				int recovery_attempt = 0;

				if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
				{
					server_gone:

					if (++recovery_attempt > 10)
					{
						Console::Err("Could not re-connect to database. Halting server.");
						std::terminate();
					}

					Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)", recovery_attempt);
					this->Close();
					util::sleep(2.0 * recovery_attempt);

					try
					{
						this->Connect(this->engine, this->host, this->port, this->user, this->pass, this->db);
					}
					catch (const Database_OpenFailed& e)
					{
						Console::Err("Connection failed: %s", e.error());
					}

					if (!this->connected)
					{
						goto server_gone;
					}

					if (this->in_transaction)
					{
#ifdef DEBUG
						Console::Dbg("Replaying %i queries.", this->transaction_log.size());
#endif // DEBUG

						if (mysql_real_query(this->impl->mysql_handle, "START TRANSACTION", std::strlen("START TRANSACTION")) != 0)
						{
							int myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
						}

						for (const std::string& q : this->transaction_log)
						{
#ifdef DATABASE_DEBUG
							Console::Dbg("%s", q.c_str());
#endif // DATABASE_DEBUG
							int myerr = 0;
							int query_result = mysql_real_query(this->impl->mysql_handle, q.c_str(), q.length());

							if (query_result == 0)
							{
								mresult = mysql_use_result(this->impl->mysql_handle);
							}

							myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else if (myerr)
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
							else
							{
								if (mresult)
								{
									mysql_free_result(mresult);
									mresult = nullptr;
								}
							}
						}
					}

					goto exec_query;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			if (this->in_transaction && !tx_control)
			{
				using namespace std;

				if (strncmp(query, "SELECT", 6) != 0)
					this->transaction_log.emplace_back(std::string(query));
			}

			num_fields = mysql_field_count(this->impl->mysql_handle);

			if ((mresult = mysql_store_result(this->impl->mysql_handle)) == 0)
			{
				if (num_fields == 0)
				{
					result.affected_rows = mysql_affected_rows(this->impl->mysql_handle);
					return result;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			fields = mysql_fetch_fields(mresult);

			for (int i = 0; i < num_fields; ++i)
			{
				if (!fields[i].name)
				{
					throw Database_QueryFailed("libMySQL critical failure!");
				}
			}

			result.resize(mysql_num_rows(mresult));
			int i = 0;
			for (MYSQL_ROW row = mysql_fetch_row(mresult); row != 0; row = mysql_fetch_row(mresult))
			{
				std::unordered_map<std::string, util::variant> resrow;
				for (int ii = 0; ii < num_fields; ++ii)
				{
					util::variant rescell;
					if (IS_NUM(fields[ii].type))
					{
						if (row[ii])
						{
							rescell = util::to_int(row[ii]);
						}
						else
						{
							rescell = 0;
						}
					}
					else
					{
						if (row[ii])
						{
							rescell = row[ii];
						}
						else
						{
							rescell = "";
						}
					}
					resrow[fields[ii].name] = rescell;
				}
				result[i++] = resrow;
			}

			mysql_free_result(mresult);
		}
		break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_exec(this->impl->sqlite_handle, query, sqlite_callback, (void *)this, 0) != SQLITE_OK)
			{
				throw Database_QueryFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}
			result = this->callbackdata;
			this->callbackdata.clear();
			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_QueryFailed("Unknown database engine");
	}

	return result;
}